

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_half_float_linear_ABGR(void *outputp,int width_times_channels,float *encode)

{
  stbir__FP16 sVar1;
  stbir__FP16 *psVar2;
  undefined8 uStack_a8;
  __m128 of [2];
  float *end_encode_m8;
  stbir__FP16 *end_output;
  stbir__FP16 *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  psVar2 = (stbir__FP16 *)((long)outputp + (long)width_times_channels * 2);
  output = (stbir__FP16 *)encode;
  if (width_times_channels < 8) {
    for (end_output = (stbir__FP16 *)((long)outputp + 8); end_output <= psVar2;
        end_output = end_output + 4) {
      sVar1 = stbir__float_to_half(*(float *)(output + 6));
      end_output[-4] = sVar1;
      sVar1 = stbir__float_to_half(*(float *)(output + 4));
      end_output[-3] = sVar1;
      sVar1 = stbir__float_to_half(*(float *)(output + 2));
      end_output[-2] = sVar1;
      sVar1 = stbir__float_to_half(*(float *)output);
      end_output[-1] = sVar1;
      output = output + 8;
    }
  }
  else {
    of[1]._8_8_ = encode + (long)width_times_channels + -8;
    end_output = (stbir__FP16 *)outputp;
    while( true ) {
      do {
        local_18 = (float)*(undefined8 *)output;
        fStack_14 = (float)((ulong)*(undefined8 *)output >> 0x20);
        uStack_10 = (undefined4)*(undefined8 *)(output + 4);
        uStack_c = (undefined4)((ulong)*(undefined8 *)(output + 4) >> 0x20);
        uStack_a8 = CONCAT44(uStack_10,uStack_c);
        of[0][1] = local_18;
        of[0][0] = fStack_14;
        local_28 = (float)*(undefined8 *)(output + 8);
        fStack_24 = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        fStack_20 = (float)*(undefined8 *)(output + 0xc);
        fStack_1c = (float)((ulong)*(undefined8 *)(output + 0xc) >> 0x20);
        of[0][3] = fStack_20;
        of[0][2] = fStack_1c;
        of[1][1] = local_28;
        of[1][0] = fStack_24;
        stbir__float_to_half_SIMD(end_output,(float *)&uStack_a8);
        output = output + 0x10;
        end_output = end_output + 8;
      } while (end_output <= psVar2 + -8);
      if (end_output == psVar2) break;
      output = (stbir__FP16 *)of[1]._8_8_;
      end_output = psVar2 + -8;
    }
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_half_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  stbir__FP16 STBIR_SIMD_STREAMOUT_PTR( * ) output = (stbir__FP16*) outputp;
  stbir__FP16 * end_output = ( (stbir__FP16*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    float const * end_encode_m8 = encode + width_times_channels - 8;
    end_output -= 8;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_SIMD_NO_UNROLL(encode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, encode );
        stbir__encode_simdf8_unflip( of );
        stbir__float_to_half_SIMD( output, (float*)&of );
      }
      #else
      {
        stbir__simdf of[2];
        stbir__simdf_load( of[0], encode );
        stbir__simdf_load( of[1], encode+4 );
        stbir__encode_simdf4_unflip( of[0] );
        stbir__encode_simdf4_unflip( of[1] );
        stbir__float_to_half_SIMD( output, (float*)of );
      }
      #endif
      #else
      stbir__float_to_half_SIMD( output, encode );
      #endif
      encode += 8;
      output += 8;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 8 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(output);
    output[0-4] = stbir__float_to_half(encode[stbir__encode_order0]);
    output[1-4] = stbir__float_to_half(encode[stbir__encode_order1]);
    output[2-4] = stbir__float_to_half(encode[stbir__encode_order2]);
    output[3-4] = stbir__float_to_half(encode[stbir__encode_order3]);
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(output);
    output[0] = stbir__float_to_half(encode[stbir__encode_order0]);
    #if stbir__coder_min_num >= 2
    output[1] = stbir__float_to_half(encode[stbir__encode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__float_to_half(encode[stbir__encode_order2]);
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}